

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void common_kv_cache_dump_view_seqs(llama_kv_cache_view *view,int row_size)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  int in_ESI;
  uint *in_RDI;
  iterator *it_1;
  int j_1;
  int i_1;
  pair<const_int,_unsigned_long> *it;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *__range1;
  size_t sz;
  int j;
  int i;
  llama_seq_id *cs_curr;
  llama_kv_cache_view_cell *c_curr;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  seqs;
  uint uVar5;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int __c;
  _Node_iterator_base<std::pair<const_int,_unsigned_long>,_false> local_c8;
  _Node_iterator_base<std::pair<const_int,_unsigned_long>,_false> local_c0;
  _Node_iterator_base<std::pair<const_int,_unsigned_long>,_false> *local_b8;
  int local_b0;
  uint local_ac;
  reference local_a8;
  _Node_iterator_base<std::pair<const_int,_unsigned_long>,_false> local_a0;
  _Node_iterator_base<std::pair<const_int,_unsigned_long>,_false> local_98;
  undefined1 *local_90;
  size_type local_88;
  _Node_iterator_base<std::pair<const_int,_unsigned_long>,_false> local_80 [3];
  _Node_iterator_base<std::pair<const_int,_unsigned_long>,_false> local_68;
  int local_60;
  int local_5c;
  long local_58;
  long local_50;
  undefined1 local_48 [60];
  int local_c;
  uint *local_8;
  
  uVar5 = in_RDI[5];
  local_c = in_ESI;
  local_8 = in_RDI;
  printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d\n"
         ,(ulong)*in_RDI,(ulong)in_RDI[1],(ulong)in_RDI[3],(ulong)in_RDI[2],(ulong)in_RDI[4]);
  std::
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::unordered_map((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                   *)0x332537);
  local_50 = *(long *)(local_8 + 6);
  local_58 = *(long *)(local_8 + 8);
  for (local_5c = 0; local_5c < (int)*local_8; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < (int)local_8[1]; local_60 = local_60 + 1) {
      if (-1 < *(int *)(local_58 + (long)local_60 * 4)) {
        local_68._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::find((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                     *)CONCAT44(in_stack_fffffffffffffefc,uVar5),(key_type *)0x3325e0);
        local_80[0]._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::end((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                    *)CONCAT44(in_stack_fffffffffffffefc,uVar5));
        bVar1 = std::__detail::operator==(&local_68,local_80);
        if (bVar1) {
          sVar2 = std::
                  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::size((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                          *)0x332634);
          if (0x3e < sVar2 + 1) break;
          sVar2 = std::
                  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::size((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                          *)0x33267b);
          local_88 = sVar2;
          pmVar3 = std::
                   unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                   ::operator[]((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                (key_type *)CONCAT44(in_stack_fffffffffffffefc,uVar5));
          *pmVar3 = sVar2;
        }
      }
    }
    sVar2 = std::
            unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
            ::size((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                    *)0x3326e7);
    if (0x3e < sVar2 + 1) break;
    local_50 = local_50 + 4;
    local_58 = local_58 + (long)(int)local_8[1] * 4;
  }
  printf("=== Sequence legend: ");
  local_90 = local_48;
  local_98._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
       ::begin((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                *)CONCAT44(in_stack_fffffffffffffefc,uVar5));
  local_a0._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
       ::end((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
              *)CONCAT44(in_stack_fffffffffffffefc,uVar5));
  while (bVar1 = std::__detail::operator!=(&local_98,&local_a0), bVar1) {
    local_a8 = std::__detail::_Node_iterator<std::pair<const_int,_unsigned_long>,_false,_false>::
               operator*((_Node_iterator<std::pair<const_int,_unsigned_long>,_false,_false> *)
                         0x33279e);
    printf("%zu=%d, ",local_a8->second,(ulong)(uint)local_a8->first);
    std::__detail::_Node_iterator<std::pair<const_int,_unsigned_long>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_int,_unsigned_long>,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  }
  printf("\'+\'=other sequence ids");
  local_50 = *(long *)(local_8 + 6);
  local_58 = *(long *)(local_8 + 8);
  for (local_ac = 0; (int)local_ac < (int)*local_8; local_ac = local_ac + 1) {
    if ((int)local_ac % local_c == 0) {
      printf("\n%5d: ",(ulong)local_ac);
    }
    for (local_b0 = 0; local_b0 < (int)local_8[1]; local_b0 = local_b0 + 1) {
      if (*(int *)(local_58 + (long)local_b0 * 4) < 0) {
        putchar(0x2e);
      }
      else {
        local_c0._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::find((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                     *)CONCAT44(in_stack_fffffffffffffefc,uVar5),(key_type *)0x332899);
        local_b8 = &local_c0;
        local_c8._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::end((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                    *)CONCAT44(in_stack_fffffffffffffefc,uVar5));
        bVar1 = std::__detail::operator!=(&local_c0,&local_c8);
        if (bVar1) {
          ppVar4 = std::__detail::_Node_iterator<std::pair<const_int,_unsigned_long>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_int,_unsigned_long>,_false,_false> *
                                )0x3328ef);
          __c = (int)"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
                     [ppVar4->second];
        }
        else {
          __c = 0x2b;
        }
        putchar(__c);
      }
    }
    putchar(0x20);
    local_50 = local_50 + 4;
    local_58 = local_58 + (long)(int)local_8[1] * 4;
  }
  printf("\n=== Done dumping\n");
  std::
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                    *)0x3329b0);
  return;
}

Assistant:

void common_kv_cache_dump_view_seqs(const llama_kv_cache_view & view, int row_size) {
    static const char slot_chars[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

    printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d\n",
        view.n_cells, view.n_seq_max, view.used_cells, view.token_count, view.max_contiguous, view.max_contiguous_idx);

    std::unordered_map<llama_seq_id, size_t> seqs;
    llama_kv_cache_view_cell * c_curr = view.cells;
    llama_seq_id * cs_curr = view.cells_sequences;

    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] < 0) { continue; }
            if (seqs.find(cs_curr[j]) == seqs.end()) {
                if (seqs.size() + 1 >= sizeof(slot_chars)) { break; }
                const size_t sz = seqs.size();
                seqs[cs_curr[j]] = sz;
            }
        }
        if (seqs.size() + 1 >= sizeof(slot_chars)) { break; }
    }

    printf("=== Sequence legend: ");
    for (const auto & it : seqs) {
        printf("%zu=%d, ", it.second, it.first);
    }
    printf("'+'=other sequence ids");

    c_curr = view.cells;
    cs_curr = view.cells_sequences;
    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        if (i % row_size == 0) {
            printf("\n%5d: ", i);
        }
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] >= 0) {
                const auto & it = seqs.find(cs_curr[j]);
                putchar(it != seqs.end() ? int(slot_chars[it->second]) : '+');
            } else {
                putchar('.');
            }
        }
        putchar(' ');
    }

    printf("\n=== Done dumping\n");
}